

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_column_writer.cpp
# Opt level: O0

void __thiscall
duckdb::PrimitiveColumnWriter::Prepare
          (PrimitiveColumnWriter *this,ColumnWriterState *state_p,ColumnWriterState *parent,
          Vector *vector,idx_t count)

{
  bool bVar1;
  PhysicalType PVar2;
  uint uVar3;
  int iVar4;
  PrimitiveColumnWriterState *count_00;
  reference pvVar5;
  size_type sVar6;
  size_type sVar7;
  idx_t iVar8;
  long lVar9;
  LogicalType *this_00;
  ulong uVar10;
  PageInformation *pPVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ColumnWriterState *in_RCX;
  ColumnWriterState *in_RDX;
  ColumnWriter *in_RSI;
  ColumnWriter *in_RDI;
  ColumnWriterState *in_R8;
  uint16_t unaff_retaddr;
  PageInformation new_info;
  PageInformation *page_info_1;
  idx_t i;
  PageInformation *page_info;
  bool check_parent_empty;
  reference<PageInformation> page_info_ref;
  idx_t vector_index;
  ValidityMask *validity;
  idx_t parent_index;
  idx_t vcount;
  value_type *col_chunk;
  PrimitiveColumnWriterState *state;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  ColumnWriterState *in_stack_fffffffffffffed0;
  uint7 in_stack_fffffffffffffed8;
  undefined1 uVar12;
  vector<duckdb::PageInformation,_std::allocator<duckdb::PageInformation>_>
  *in_stack_fffffffffffffee0;
  ColumnWriterState *state_00;
  ColumnWriter *in_stack_ffffffffffffff00;
  ValidityMask *this_01;
  byte local_d9;
  ColumnWriterState *local_d0;
  PageInformation local_b8;
  reference local_90;
  PageInformation *local_80;
  ColumnWriterState *local_78;
  PageInformation *local_70;
  byte local_61;
  reference_wrapper<duckdb::PageInformation> local_60;
  long local_58;
  ValidityMask *local_50;
  size_type local_48;
  ColumnWriterState *local_40;
  PrimitiveColumnWriterState *count_01;
  ColumnWriterState *validity_00;
  ColumnWriterState *state_01;
  
  count_00 = ColumnWriterState::Cast<duckdb::PrimitiveColumnWriterState>(in_stack_fffffffffffffed0);
  local_d0 = in_R8;
  pvVar5 = vector<duckdb_parquet::ColumnChunk,_true>::operator[]
                     ((vector<duckdb_parquet::ColumnChunk,_true> *)in_stack_fffffffffffffed0,
                      CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  state_00 = local_d0;
  if (in_RDX != (ColumnWriterState *)0x0) {
    sVar6 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                      (&(in_RDX->definition_levels).
                        super_vector<unsigned_short,_std::allocator<unsigned_short>_>);
    state_00 = local_d0;
    sVar7 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                      (&(count_00->super_ColumnWriterState).definition_levels.
                        super_vector<unsigned_short,_std::allocator<unsigned_short>_>);
    local_d0 = (ColumnWriterState *)(sVar6 - sVar7);
  }
  local_40 = local_d0;
  local_48 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                       (&(count_00->super_ColumnWriterState).definition_levels.
                         super_vector<unsigned_short,_std::allocator<unsigned_short>_>);
  local_50 = FlatVector::Validity((Vector *)0x86be51);
  count_01 = count_00;
  validity_00 = state_00;
  state_01 = in_RDX;
  ColumnWriter::MaxRepeat(in_RDI);
  ColumnWriter::HandleRepeatLevels
            (in_stack_ffffffffffffff00,state_00,in_RDX,(idx_t)count_00,
             (idx_t)in_stack_fffffffffffffee0);
  this_01 = local_50;
  ColumnWriter::MaxDefine(in_RDI);
  iVar8 = ColumnWriter::MaxDefine(in_RDI);
  uVar3 = (uint)(ushort)((short)iVar8 - 1);
  ColumnWriter::HandleDefineLevels
            (in_RSI,state_01,in_RCX,(ValidityMask *)validity_00,(idx_t)count_01,
             (uint16_t)((ulong)pvVar5 >> 0x30),unaff_retaddr);
  local_58 = 0;
  vector<duckdb::PageInformation,_true>::back((vector<duckdb::PageInformation,_true> *)this_01);
  std::reference_wrapper<duckdb::PageInformation>::
  reference_wrapper<duckdb::PageInformation&,void,duckdb::PageInformation*>
            ((reference_wrapper<duckdb::PageInformation> *)in_stack_fffffffffffffed0,
             (PageInformation *)CONCAT44(in_stack_fffffffffffffecc,uVar3));
  lVar9 = NumericCast<long,unsigned_long,void>(0x86bf62);
  (pvVar5->meta_data).num_values = lVar9 + (pvVar5->meta_data).num_values;
  local_d9 = 0;
  if (state_01 != (ColumnWriterState *)0x0) {
    bVar1 = std::vector<bool,_std::allocator<bool>_>::empty
                      ((vector<bool,_std::allocator<bool>_> *)this_01);
    local_d9 = bVar1 ^ 0xff;
  }
  local_61 = local_d9 & 1;
  if ((local_61 == 0) &&
     (bVar1 = TemplatedValidityMask<unsigned_long>::AllValid
                        ((TemplatedValidityMask<unsigned_long> *)local_50), bVar1)) {
    this_00 = Vector::GetType((Vector *)in_RCX);
    PVar2 = LogicalType::InternalType(this_00);
    uVar10 = duckdb::TypeIsConstantSize(PVar2);
    if ((uVar10 & 1) != 0) {
      pPVar11 = std::reference_wrapper<duckdb::PageInformation>::get(&local_60);
      in_stack_fffffffffffffee0 =
           (vector<duckdb::PageInformation,_std::allocator<duckdb::PageInformation>_> *)
           pPVar11->estimated_page_size;
      iVar4 = (*in_RDI->_vptr_ColumnWriter[0xe])(in_RDI,in_RCX,local_58,count_01);
      if ((pointer *)
          ((long)&(in_stack_fffffffffffffee0->
                  super__Vector_base<duckdb::PageInformation,_std::allocator<duckdb::PageInformation>_>
                  )._M_impl.super__Vector_impl_data._M_start +
          CONCAT44(extraout_var,iVar4) * (long)local_40) < (pointer *)0x6400000) {
        local_70 = std::reference_wrapper<duckdb::PageInformation>::get(&local_60);
        local_70->row_count = (long)&local_40->_vptr_ColumnWriterState + local_70->row_count;
        iVar4 = (*in_RDI->_vptr_ColumnWriter[0xe])(in_RDI,in_RCX,local_58,count_01);
        local_70->estimated_page_size =
             CONCAT44(extraout_var_00,iVar4) * (long)local_40 + local_70->estimated_page_size;
        return;
      }
    }
  }
  for (local_78 = (ColumnWriterState *)0x0; local_78 < local_40;
      local_78 = (ColumnWriterState *)((long)&local_78->_vptr_ColumnWriterState + 1)) {
    local_80 = std::reference_wrapper<duckdb::PageInformation>::get(&local_60);
    local_80->row_count = local_80->row_count + 1;
    uVar12 = false;
    if ((local_61 & 1) != 0) {
      local_90 = vector<bool,_true>::operator[]
                           ((vector<bool,_true> *)in_stack_fffffffffffffed0,
                            CONCAT44(in_stack_fffffffffffffecc,uVar3));
      uVar12 = std::_Bit_reference::operator_cast_to_bool(&local_90);
    }
    if ((bool)uVar12 == false) {
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        ((TemplatedValidityMask<unsigned_long> *)(ulong)in_stack_fffffffffffffed8,
                         (idx_t)in_stack_fffffffffffffed0);
      if (bVar1) {
        iVar4 = (*in_RDI->_vptr_ColumnWriter[0xe])(in_RDI,in_RCX,local_58,count_01);
        local_80->estimated_page_size =
             CONCAT44(extraout_var_01,iVar4) + local_80->estimated_page_size;
        if (0x63fffff < local_80->estimated_page_size) {
          PageInformation::PageInformation(&local_b8);
          local_b8.offset = local_80->offset + local_80->row_count;
          std::vector<duckdb::PageInformation,_std::allocator<duckdb::PageInformation>_>::push_back
                    (in_stack_fffffffffffffee0,
                     (value_type *)CONCAT17(uVar12,in_stack_fffffffffffffed8));
          vector<duckdb::PageInformation,_true>::back
                    ((vector<duckdb::PageInformation,_true> *)this_01);
          std::reference_wrapper<duckdb::PageInformation>::
          reference_wrapper<duckdb::PageInformation&,void,duckdb::PageInformation*>
                    ((reference_wrapper<duckdb::PageInformation> *)in_stack_fffffffffffffed0,
                     (PageInformation *)CONCAT44(in_stack_fffffffffffffecc,uVar3));
        }
      }
      else {
        local_80->null_count = local_80->null_count + 1;
      }
      local_58 = local_58 + 1;
    }
    else {
      local_80->empty_count = local_80->empty_count + 1;
    }
  }
  return;
}

Assistant:

void PrimitiveColumnWriter::Prepare(ColumnWriterState &state_p, ColumnWriterState *parent, Vector &vector,
                                    idx_t count) {
	auto &state = state_p.Cast<PrimitiveColumnWriterState>();
	auto &col_chunk = state.row_group.columns[state.col_idx];

	idx_t vcount = parent ? parent->definition_levels.size() - state.definition_levels.size() : count;
	idx_t parent_index = state.definition_levels.size();
	auto &validity = FlatVector::Validity(vector);
	HandleRepeatLevels(state, parent, count, MaxRepeat());
	HandleDefineLevels(state, parent, validity, count, MaxDefine(), MaxDefine() - 1);

	idx_t vector_index = 0;
	reference<PageInformation> page_info_ref = state.page_info.back();
	col_chunk.meta_data.num_values += NumericCast<int64_t>(vcount);

	const bool check_parent_empty = parent && !parent->is_empty.empty();
	if (!check_parent_empty && validity.AllValid() && TypeIsConstantSize(vector.GetType().InternalType()) &&
	    page_info_ref.get().estimated_page_size + GetRowSize(vector, vector_index, state) * vcount <
	        MAX_UNCOMPRESSED_PAGE_SIZE) {
		// Fast path: fixed-size type, all valid, and it fits on the current page
		auto &page_info = page_info_ref.get();
		page_info.row_count += vcount;
		page_info.estimated_page_size += GetRowSize(vector, vector_index, state) * vcount;
	} else {
		for (idx_t i = 0; i < vcount; i++) {
			auto &page_info = page_info_ref.get();
			page_info.row_count++;
			if (check_parent_empty && parent->is_empty[parent_index + i]) {
				page_info.empty_count++;
				continue;
			}
			if (validity.RowIsValid(vector_index)) {
				page_info.estimated_page_size += GetRowSize(vector, vector_index, state);
				if (page_info.estimated_page_size >= MAX_UNCOMPRESSED_PAGE_SIZE) {
					PageInformation new_info;
					new_info.offset = page_info.offset + page_info.row_count;
					state.page_info.push_back(new_info);
					page_info_ref = state.page_info.back();
				}
			} else {
				page_info.null_count++;
			}
			vector_index++;
		}
	}
}